

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_schema.c
# Opt level: O1

LY_ERR lys_print_module(ly_out *out,lys_module *module,LYS_OUTFORMAT format,size_t line_length,
                       uint32_t options)

{
  LY_ERR LVar1;
  char *format_00;
  ly_ctx *ctx;
  char *pcVar2;
  
  if (out == (ly_out *)0x0) {
    pcVar2 = "out";
LAB_0018e231:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lys_print_module")
    ;
    return LY_EINVAL;
  }
  if (module == (lys_module *)0x0) {
    pcVar2 = "module";
    goto LAB_0018e231;
  }
  out->func_printed = 0;
  switch(format) {
  case LYS_OUT_YANG:
    if (module->parsed != (lysp_module *)0x0) {
      LVar1 = yang_print_parsed_module(out,module->parsed,options);
      return LVar1;
    }
    break;
  case LYS_OUT_YANG_COMPILED:
    if (module->compiled != (lysc_module *)0x0) {
      LVar1 = yang_print_compiled(out,module,options);
      return LVar1;
    }
    ctx = module->ctx;
    pcVar2 = module->name;
    format_00 = "Module \"%s\" compiled module missing.";
    goto LAB_0018e2bc;
  case LYS_OUT_YIN:
    if (module->parsed != (lysp_module *)0x0) {
      LVar1 = yin_print_parsed_module(out,module->parsed,options);
      return LVar1;
    }
    break;
  case LYS_OUT_TREE:
    if (module->parsed != (lysp_module *)0x0) {
      LVar1 = tree_print_module(out,module,options,line_length);
      return LVar1;
    }
    break;
  default:
    ly_log(module->ctx,LY_LLERR,LY_EINVAL,"Unsupported output format.");
    return LY_EINVAL;
  }
  ctx = module->ctx;
  pcVar2 = module->name;
  format_00 = "Module \"%s\" parsed module missing.";
LAB_0018e2bc:
  ly_log(ctx,LY_LLERR,LY_EINVAL,format_00,pcVar2);
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_print_module(struct ly_out *out, const struct lys_module *module, LYS_OUTFORMAT format, size_t line_length,
        uint32_t options)
{
    LY_ERR ret;

    LY_CHECK_ARG_RET(NULL, out, module, LY_EINVAL);

    /* reset number of printed bytes */
    out->func_printed = 0;

    switch (format) {
    case LYS_OUT_YANG:
        if (!module->parsed) {
            LOGERR(module->ctx, LY_EINVAL, "Module \"%s\" parsed module missing.", module->name);
            ret = LY_EINVAL;
            break;
        }

        ret = yang_print_parsed_module(out, module->parsed, options);
        break;
    case LYS_OUT_YANG_COMPILED:
        if (!module->compiled) {
            LOGERR(module->ctx, LY_EINVAL, "Module \"%s\" compiled module missing.", module->name);
            ret = LY_EINVAL;
            break;
        }

        ret = yang_print_compiled(out, module, options);
        break;
    case LYS_OUT_YIN:
        if (!module->parsed) {
            LOGERR(module->ctx, LY_EINVAL, "Module \"%s\" parsed module missing.", module->name);
            ret = LY_EINVAL;
            break;
        }

        ret = yin_print_parsed_module(out, module->parsed, options);
        break;
    case LYS_OUT_TREE:
        if (!module->parsed) {
            LOGERR(module->ctx, LY_EINVAL, "Module \"%s\" parsed module missing.", module->name);
            ret = LY_EINVAL;
            break;
        }
        ret = tree_print_module(out, module, options, line_length);
        break;
    default:
        LOGERR(module->ctx, LY_EINVAL, "Unsupported output format.");
        ret = LY_EINVAL;
        break;
    }

    return ret;
}